

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

bool __thiscall
google::
dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::serialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
          (dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,_IO_FILE *param_2)

{
  int iVar1;
  bool bVar2;
  ulong in_RAX;
  long lVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  int bit;
  long lVar8;
  undefined7 uStack_38;
  uchar bits;
  
  _uStack_38 = in_RAX;
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar2 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>(param_2,0x13578642,4);
  if (((bVar2) &&
      (bVar2 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                         (param_2,*(unsigned_long *)(this + 0x58),8), bVar2)) &&
     (bVar2 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        (param_2,*(unsigned_long *)(this + 0x50),8), bVar2)) {
    lVar7 = 0;
    uVar6 = 0;
    while( true ) {
      if (*(ulong *)(this + 0x58) <= uVar6) {
        return true;
      }
      _uStack_38 = _uStack_38 & 0xffffffffffffff;
      iVar4 = *(int *)(this + 0x38);
      bVar5 = 0;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        if (uVar6 + lVar3 < *(ulong *)(this + 0x58)) {
          iVar4 = iVar4 + 1;
          iVar1 = *(int *)(*(long *)(this + 0x70) + lVar7 + lVar3 * 4);
          *(int *)(this + 0x38) = iVar4;
          if (iVar1 + *(int *)(this + 0x40) != 0) {
            bVar5 = bVar5 | (byte)(1 << ((byte)lVar3 & 0x1f));
            _uStack_38 = CONCAT17(bVar5,uStack_38);
          }
        }
      }
      bVar2 = sparsehash_internal::write_data<_IO_FILE>(param_2,&bits,1);
      if (!bVar2) break;
      lVar3 = lVar7;
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        if (((bits >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
           (bVar2 = sparsehash_internal::write_data<_IO_FILE>
                              (param_2,(void *)(*(long *)(this + 0x70) + lVar3),4), !bVar2)) {
          return false;
        }
        lVar3 = lVar3 + 4;
      }
      uVar6 = uVar6 + 8;
      lVar7 = lVar7 + 0x20;
    }
  }
  return false;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }